

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_TestShell::
~TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_TestShell
          (TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_TestShell
           *this)

{
  TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_TestShell
  *this_local;
  
  ~TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(JUnitOutputTest, withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock)
{
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");

    STRCMP_EQUAL("<testcase classname=\"groupname\" name=\"testname\" assertions=\"0\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
    STRCMP_EQUAL("</testcase>\n", outputFile->line(6));
}